

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

int __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
::Add(List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
      *this,RecyclerWeakReference<Js::ScriptFunctionType> **item)

{
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> *addr;
  int iVar1;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar2;
  
  EnsureArray(this,0);
  pRVar2 = *item;
  addr = (this->
         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
         ).buffer.ptr +
         (this->
         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
         ).count;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pRVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  iVar1 = (this->
          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
          ).count;
  (this->
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
  ).count = iVar1 + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }